

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

CTcSymbol * CTcSymbolBase::read_from_sym_file(CVmFile *fp)

{
  uint uVar1;
  CTcSymbol *pCVar2;
  
  uVar1 = CVmFile::read_uint2(fp);
  switch(uVar1) {
  case 1:
    pCVar2 = CTcSymFuncBase::read_from_sym_file(fp);
    return pCVar2;
  case 2:
    pCVar2 = CTcSymObjBase::read_from_sym_file(fp);
    return pCVar2;
  case 3:
    pCVar2 = CTcSymPropBase::read_from_sym_file(fp);
    return pCVar2;
  default:
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2db4);
    return (CTcSymbol *)0x0;
  case 9:
    pCVar2 = CTcSymMetaclassBase::read_from_sym_file(fp);
    return pCVar2;
  case 10:
    pCVar2 = CTcSymEnumBase::read_from_sym_file(fp);
    return pCVar2;
  }
}

Assistant:

CTcSymbol *CTcSymbolBase::read_from_sym_file(CVmFile *fp)
{
    /* 
     *   read the type - this is the one thing we know is always present for
     *   every symbol (the rest of the data might vary per subclass) 
     */
    tc_symtype_t typ = (tc_symtype_t)fp->read_uint2();

    /* create the object based on the type */
    switch(typ)
    {
    case TC_SYM_FUNC:
        return CTcSymFunc::read_from_sym_file(fp);

    case TC_SYM_OBJ:
        return CTcSymObj::read_from_sym_file(fp);

    case TC_SYM_PROP:
        return CTcSymProp::read_from_sym_file(fp);

    case TC_SYM_ENUM:
        return CTcSymEnum::read_from_sym_file(fp);

    case TC_SYM_METACLASS:
        return CTcSymMetaclass::read_from_sym_file(fp);

    default:
        /* other types should not be in a symbol file */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_SYMEXP_INV_TYPE);
        return 0;
    }
}